

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::SetPsbtTxInScriptAndKeyList
               (wally_psbt_input *input,bool is_witness,Script *redeem_script,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
               Script *locking_script)

{
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  undefined8 uVar4;
  Script *in_stack_fffffffffffffdf0;
  allocator *paVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string *message;
  undefined8 in_stack_fffffffffffffe08;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  wally_psbt_input *in_stack_fffffffffffffe10;
  allocator local_199;
  string local_198 [32];
  CfdSourceLocation local_178;
  undefined1 local_15a;
  undefined1 local_159 [33];
  CfdSourceLocation local_138;
  Script local_120;
  ByteData local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  ByteData local_68;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  int ret;
  Script *locking_script_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_local;
  Script *redeem_script_local;
  bool is_witness_local;
  wally_psbt_input *input_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  bVar1 = Script::IsEmpty(redeem_script);
  if (!bVar1) {
    Script::GetData(&local_68,redeem_script);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&local_68);
    ByteData::~ByteData((ByteData *)0x465f83);
    if ((is_witness) && (bVar1 = Script::IsP2wpkhScript(redeem_script), !bVar1)) {
      puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x465fc9);
      sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           wally_psbt_input_set_witness_script(input,puVar2,sVar3);
      if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        local_90.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_90.filename = local_90.filename + 1;
        local_90.line = 0xfa;
        local_90.funcname = "SetPsbtTxInScriptAndKeyList";
        logger::warn<int&>(&local_90,"wally_psbt_input_set_witness_script NG[{}]",
                           (int *)((long)&script_val.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        local_b2 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_b0,"psbt add witness script error.",&local_b1);
        CfdException::CfdException
                  ((CfdException *)in_stack_fffffffffffffe10,error_code,in_stack_fffffffffffffe00);
        local_b2 = 0;
        __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar1 = Script::IsP2shScript(locking_script);
      if (bVar1) {
        ScriptUtil::CreateP2wshLockingScript(&local_120,redeem_script);
        Script::GetData(&local_e8,&local_120);
        ByteData::GetBytes(&local_d0,&local_e8);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe00);
        ByteData::~ByteData((ByteData *)0x4661d7);
        Script::~Script(in_stack_fffffffffffffdf0);
      }
      else {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      }
    }
    bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    if (!bVar1) {
      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50;
      in_stack_fffffffffffffe10 = input;
      puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x466253);
      sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
      error_code = (CfdError)((ulong)this >> 0x20);
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           wally_psbt_input_set_redeem_script(in_stack_fffffffffffffe10,puVar2,sVar3);
      if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        local_138.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_138.filename = local_138.filename + 1;
        local_138.line = 0x10a;
        local_138.funcname = "SetPsbtTxInScriptAndKeyList";
        logger::warn<int&>(&local_138,"wally_psbt_input_set_redeem_script NG[{}]",
                           (int *)((long)&script_val.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        local_15a = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        message = (string *)local_159;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_159 + 1),"psbt add redeem script error.",(allocator *)message);
        CfdException::CfdException((CfdException *)in_stack_fffffffffffffe10,error_code,message);
        local_15a = 0;
        __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00);
  }
  bVar1 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty(key_list);
  if (!bVar1) {
    SetKeyPathMap(key_list,&input->keypaths);
    script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = wally_map_sort(&input->keypaths,0);
    if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      local_178.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_178.filename = local_178.filename + 1;
      local_178.line = 0x115;
      local_178.funcname = "SetPsbtTxInScriptAndKeyList";
      logger::warn<int&>(&local_178,"wally_map_sort NG[{}]",
                         (int *)((long)&script_val.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      uVar4 = __cxa_allocate_exception(0x30);
      paVar5 = &local_199;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_198,"psbt input sort keypaths error.",paVar5);
      CfdException::CfdException
                ((CfdException *)in_stack_fffffffffffffe10,error_code,in_stack_fffffffffffffe00);
      __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

void SetPsbtTxInScriptAndKeyList(
    struct wally_psbt_input *input, bool is_witness,
    const Script &redeem_script, const std::vector<KeyData> &key_list,
    const Script &locking_script) {
  int ret;
  if (!redeem_script.IsEmpty()) {
    auto script_val = redeem_script.GetData().GetBytes();
    if (is_witness && (!redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_input_set_witness_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_input_set_witness_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness script error.");
      }
      if (locking_script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_input_set_redeem_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &input->keypaths);
    ret = wally_map_sort(&input->keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort keypaths error.");
    }
  }
}